

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::ClampEnd(ON_NurbsSurface *this,int dir,int end)

{
  bool bVar1;
  uint dir_00;
  ON_NurbsCurve crv;
  ON_NurbsCurve local_60;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  ON_NurbsCurve::ON_NurbsCurve(&local_60);
  local_60.m_knot = this->m_knot[dir != 0];
  dir_00 = (uint)(dir != 0);
  ON_Internal_ConvertToCurve(this,dir_00,&local_60);
  bVar1 = ON_NurbsCurve::ClampEnd(&local_60,end);
  ON_Internal_ConvertFromCurve(&local_60,dir_00,this);
  ON_NurbsCurve::~ON_NurbsCurve(&local_60);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::ClampEnd(
          int dir,         // dir 0 = "s", 1 = "t"
          int end// 0 = clamp start, 1 = clamp end, 2 = clamp start and end
          )
{
  DestroySurfaceTree();
  if (dir)
    dir = 1;
  ON_NurbsCurve crv;
  crv.m_knot = m_knot[dir];
  ON_Internal_ConvertToCurve(*this,dir,crv);
  bool rc = crv.ClampEnd(end);
  ON_Internal_ConvertFromCurve(crv,dir,*this);
  return rc;
}